

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O2

int32_t ucol_normalizeShortDefinitionString_63
                  (char *definition,char *destination,int32_t capacity,UParseError *parseError,
                  UErrorCode *status)

{
  int iVar1;
  byte *__src;
  char cVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  UParseError *parseError_00;
  long lVar6;
  UParseError pe;
  CollatorSpec s;
  UParseError local_3c0;
  CollatorSpec local_378;
  
  iVar5 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (destination != (char *)0x0) {
      memset(destination,0,(long)capacity);
    }
    parseError_00 = &local_3c0;
    if (parseError != (UParseError *)0x0) {
      parseError_00 = parseError;
    }
    ucol_sit_initCollatorSpecs(&local_378);
    ucol_sit_readSpecs(&local_378,definition,parseError_00,status);
    iVar5 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar5 = 0;
      for (lVar6 = 0; lVar6 != 0x11; lVar6 = lVar6 + 1) {
        __src = (byte *)local_378.entries[lVar6].start;
        if (__src != (byte *)0x0) {
          if (iVar5 == 0) {
            iVar5 = 0;
          }
          else {
            if (iVar5 < capacity) {
              sVar3 = strlen(destination);
              (destination + sVar3)[0] = '_';
              (destination + sVar3)[1] = '\0';
            }
            iVar5 = iVar5 + 1;
          }
          if ((*__src - 0x4b < 0xc) && ((0x883U >> (*__src - 0x4b & 0x1f) & 1) != 0)) {
            for (lVar4 = 0; iVar1 = local_378.entries[lVar6].len, lVar4 < iVar1; lVar4 = lVar4 + 1)
            {
              if (iVar5 + lVar4 < (long)capacity) {
                cVar2 = uprv_toupper_63(local_378.entries[lVar6].start[lVar4]);
                destination[lVar4 + iVar5] = cVar2;
              }
            }
            iVar5 = iVar1 + iVar5;
          }
          else {
            iVar1 = local_378.entries[lVar6].len;
            iVar5 = iVar5 + iVar1;
            if (iVar5 < capacity) {
              strncat(destination,(char *)__src,(long)iVar1);
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_normalizeShortDefinitionString(const char *definition,
                                    char *destination,
                                    int32_t capacity,
                                    UParseError *parseError,
                                    UErrorCode *status)
{

    if(U_FAILURE(*status)) {
        return 0;
    }

    if(destination) {
        uprv_memset(destination, 0, capacity*sizeof(char));
    }

    UParseError pe;
    if(!parseError) {
        parseError = &pe;
    }

    // validate
    CollatorSpec s;
    ucol_sit_initCollatorSpecs(&s);
    ucol_sit_readSpecs(&s, definition, parseError, status);
    return ucol_sit_dumpSpecs(&s, destination, capacity, status);
}